

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iter.c
# Opt level: O0

void test_bson_iter_overwrite_double(void)

{
  byte bVar1;
  int iVar2;
  double dVar3;
  bson_t b;
  bson_iter_t iter;
  undefined1 auStack_180 [128];
  undefined1 local_100 [248];
  
  bson_init(auStack_180);
  bVar1 = bson_append_double(0x4093487e5c91d14e,auStack_180,"key",0xffffffff);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x1cd,"test_bson_iter_overwrite_double",
            "bson_append_double (&b, \"key\", -1, 1234.1234)");
    abort();
  }
  bVar1 = bson_iter_init_find(local_100,auStack_180,"key");
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x1ce,"test_bson_iter_overwrite_double","bson_iter_init_find (&iter, &b, \"key\")");
    abort();
  }
  iVar2 = bson_iter_type(local_100);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x1cf,"test_bson_iter_overwrite_double","BSON_ITER_HOLDS_DOUBLE (&iter)");
    abort();
  }
  bson_iter_overwrite_double(0x40b2211f97247454,local_100);
  bVar1 = bson_iter_init_find(local_100,auStack_180,"key");
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x1d1,"test_bson_iter_overwrite_double","bson_iter_init_find (&iter, &b, \"key\")");
    abort();
  }
  iVar2 = bson_iter_type(local_100);
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c",
            0x1d2,"test_bson_iter_overwrite_double","BSON_ITER_HOLDS_DOUBLE (&iter)");
    abort();
  }
  dVar3 = (double)bson_iter_double(local_100);
  if ((dVar3 == 4641.1234) && (!NAN(dVar3))) {
    bson_destroy(auStack_180);
    return;
  }
  fprintf(_stderr,"FAIL\n\nAssert Failure: (line#%d)bson_iter_double (&iter) == 4641.1234\n",0x1d3);
  abort();
}

Assistant:

static void
test_bson_iter_overwrite_double (void)
{
   bson_iter_t iter;
   bson_t b;

   bson_init (&b);
   BSON_ASSERT (bson_append_double (&b, "key", -1, 1234.1234));
   BSON_ASSERT (bson_iter_init_find (&iter, &b, "key"));
   BSON_ASSERT (BSON_ITER_HOLDS_DOUBLE (&iter));
   bson_iter_overwrite_double (&iter, 4641.1234);
   BSON_ASSERT (bson_iter_init_find (&iter, &b, "key"));
   BSON_ASSERT (BSON_ITER_HOLDS_DOUBLE (&iter));
   BSON_ASSERT_CMPINT (bson_iter_double (&iter), ==, 4641.1234);
   bson_destroy (&b);
}